

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O3

int run_test_udp_multicast_join6(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  anon_union_28_2_e90107a3_for_address *paVar2;
  uv_loop_t *loop;
  ulong uVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  undefined7 uVar4;
  code *addr_00;
  uv_udp_t *puVar5;
  char *pcVar6;
  uv_udp_send_t *loop_00;
  uv_udp_send_t *puVar7;
  uv_udp_send_t *req;
  int in_R8D;
  bool bVar8;
  sockaddr_in6 addr;
  uv_buf_t uStack_c0;
  sockaddr_in6 sStack_ac;
  uv_loop_t *puStack_90;
  char acStack_88 [64];
  code *pcStack_48;
  code *pcStack_40;
  int local_34;
  uv_interface_address_t *local_30;
  
  pcStack_40 = (code *)0x1867be;
  iVar1 = uv_interface_addresses(&stack0xffffffffffffffd0,&local_34);
  if (iVar1 != 0) {
LAB_0018697e:
    pcStack_40 = (code *)0x186983;
    run_test_udp_multicast_join6_cold_17();
    return 1;
  }
  if ((long)local_34 < 1) {
    pcStack_40 = (code *)0x18697e;
    uv_free_interface_addresses(local_30,local_34);
    goto LAB_0018697e;
  }
  paVar2 = &local_30->address;
  uVar3 = 1;
  do {
    uVar4 = (undefined7)((ulong)unaff_RBX >> 8);
    unaff_RBX = (uv_loop_t *)CONCAT71(uVar4,1);
    if ((paVar2->address4).sin_family == 10) {
      unaff_RBX = (uv_loop_t *)CONCAT71(uVar4,*(int *)((long)paVar2 + -4) != 0);
    }
    if ((char)unaff_RBX == '\0') break;
    paVar2 = (anon_union_28_2_e90107a3_for_address *)((long)paVar2 + 0x50);
    bVar8 = uVar3 < (ulong)(long)local_34;
    uVar3 = uVar3 + 1;
  } while (bVar8);
  pcStack_40 = (code *)0x18680a;
  uv_free_interface_addresses(local_30,local_34);
  if ((char)unaff_RBX != '\0') goto LAB_0018697e;
  loop_00 = (uv_udp_send_t *)0x1a8c0b;
  addr_00 = (code *)0x23a3;
  pcStack_40 = (code *)0x186828;
  iVar1 = uv_ip6_addr("::",0x23a3,(sockaddr_in6 *)&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    pcStack_40 = (code *)0x186835;
    loop_00 = (uv_udp_send_t *)uv_default_loop();
    puVar5 = &server;
    pcStack_40 = (code *)0x186844;
    iVar1 = uv_udp_init((uv_loop_t *)loop_00,&server);
    addr_00 = (code *)puVar5;
    if (iVar1 != 0) goto LAB_001869d7;
    pcStack_40 = (code *)0x186851;
    loop_00 = (uv_udp_send_t *)uv_default_loop();
    puVar5 = &client;
    pcStack_40 = (code *)0x186860;
    iVar1 = uv_udp_init((uv_loop_t *)loop_00,&client);
    addr_00 = (code *)puVar5;
    if (iVar1 != 0) goto LAB_001869dc;
    puVar5 = &server;
    addr_00 = (code *)&stack0xffffffffffffffd0;
    pcStack_40 = (code *)0x18687b;
    iVar1 = uv_udp_bind(&server,(sockaddr *)addr_00,0);
    loop_00 = (uv_udp_send_t *)puVar5;
    if (iVar1 != 0) goto LAB_001869e1;
    puVar5 = &server;
    pcVar6 = "ff02::1";
    pcStack_40 = (code *)0x18689d;
    iVar1 = uv_udp_set_membership(&server,"ff02::1",(char *)0x0,UV_JOIN_GROUP);
    if (iVar1 == 0) {
      puVar5 = &server;
      addr_00 = alloc_cb;
      pcStack_40 = (code *)0x1868bf;
      iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
      loop_00 = (uv_udp_send_t *)puVar5;
      if (iVar1 != 0) goto LAB_001869eb;
      loop_00 = &::req;
      pcStack_40 = (code *)0x1868d3;
      iVar1 = do_send(&::req);
      if (iVar1 != 0) goto LAB_001869f0;
      if (close_cb_called != 0) goto LAB_001869f5;
      if (cl_recv_cb_called != 0) goto LAB_001869fa;
      if (sv_send_cb_called != 0) goto LAB_001869ff;
      pcStack_40 = (code *)0x186907;
      loop_00 = (uv_udp_send_t *)uv_default_loop();
      addr_00 = (code *)0x0;
      pcStack_40 = (code *)0x186911;
      uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
      if (cl_recv_cb_called != 2) goto LAB_00186a04;
      if (sv_send_cb_called != 2) goto LAB_00186a09;
      if (close_cb_called != 2) goto LAB_00186a0e;
      pcStack_40 = (code *)0x18693d;
      loop = uv_default_loop();
      unaff_RBX = (uv_loop_t *)0x0;
      pcStack_40 = (code *)0x186953;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      addr_00 = (code *)0x0;
      pcStack_40 = (code *)0x18695d;
      uv_run(loop,UV_RUN_DEFAULT);
      pcStack_40 = (code *)0x186962;
      loop_00 = (uv_udp_send_t *)uv_default_loop();
      pcStack_40 = (code *)0x18696a;
      iVar1 = uv_loop_close((uv_loop_t *)loop_00);
      if (iVar1 == 0) {
        pcStack_40 = (code *)0x186977;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00186a13;
    }
    addr_00 = (code *)pcVar6;
    loop_00 = (uv_udp_send_t *)puVar5;
    if (iVar1 != -0x13) goto LAB_001869e6;
    pcStack_40 = (code *)0x18698f;
    unaff_RBX = uv_default_loop();
    pcStack_40 = (code *)0x1869a3;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    addr_00 = (code *)0x0;
    pcStack_40 = (code *)0x1869ad;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_40 = (code *)0x1869b2;
    loop_00 = (uv_udp_send_t *)uv_default_loop();
    pcStack_40 = (code *)0x1869ba;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      pcStack_40 = (code *)0x1869c3;
      run_test_udp_multicast_join6_cold_15();
      return 1;
    }
  }
  else {
    pcStack_40 = (code *)0x1869d7;
    run_test_udp_multicast_join6_cold_1();
LAB_001869d7:
    pcStack_40 = (code *)0x1869dc;
    run_test_udp_multicast_join6_cold_2();
LAB_001869dc:
    pcStack_40 = (code *)0x1869e1;
    run_test_udp_multicast_join6_cold_3();
LAB_001869e1:
    pcStack_40 = (code *)0x1869e6;
    run_test_udp_multicast_join6_cold_4();
LAB_001869e6:
    pcStack_40 = (code *)0x1869eb;
    run_test_udp_multicast_join6_cold_16();
LAB_001869eb:
    pcStack_40 = (code *)0x1869f0;
    run_test_udp_multicast_join6_cold_5();
LAB_001869f0:
    pcStack_40 = (code *)0x1869f5;
    run_test_udp_multicast_join6_cold_6();
LAB_001869f5:
    pcStack_40 = (code *)0x1869fa;
    run_test_udp_multicast_join6_cold_7();
LAB_001869fa:
    pcStack_40 = (code *)0x1869ff;
    run_test_udp_multicast_join6_cold_8();
LAB_001869ff:
    pcStack_40 = (code *)0x186a04;
    run_test_udp_multicast_join6_cold_9();
LAB_00186a04:
    pcStack_40 = (code *)0x186a09;
    run_test_udp_multicast_join6_cold_10();
LAB_00186a09:
    pcStack_40 = (code *)0x186a0e;
    run_test_udp_multicast_join6_cold_11();
LAB_00186a0e:
    pcStack_40 = (code *)0x186a13;
    run_test_udp_multicast_join6_cold_12();
LAB_00186a13:
    pcStack_40 = (code *)0x186a18;
    run_test_udp_multicast_join6_cold_13();
  }
  pcStack_40 = alloc_cb;
  run_test_udp_multicast_join6_cold_14();
  req = (uv_udp_send_t *)
        CONCAT71(0x5892,loop_00 == (uv_udp_send_t *)&client || loop_00 == (uv_udp_send_t *)&server);
  if (loop_00 == (uv_udp_send_t *)&client || loop_00 == (uv_udp_send_t *)&server) {
    if (addr_00 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    pcStack_48 = (code *)0x186a5e;
    alloc_cb_cold_1();
  }
  pcStack_48 = cl_recv_cb;
  alloc_cb_cold_2();
  bVar8 = loop_00 == (uv_udp_send_t *)&server;
  puVar7 = (uv_udp_send_t *)
           CONCAT71((int7)((ulong)loop_00 >> 8),loop_00 == (uv_udp_send_t *)&client || bVar8);
  if (loop_00 == (uv_udp_send_t *)&client || bVar8) {
    if (in_R8D != 0) goto LAB_00186b63;
    if ((long)addr_00 < 0) goto LAB_00186b68;
    if ((uv_udp_t *)addr_00 != (uv_udp_t *)0x0) {
      if (req == (uv_udp_send_t *)0x0) goto LAB_00186b6d;
      if ((uv_udp_t *)addr_00 != (uv_udp_t *)0x4) goto LAB_00186b72;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        cl_recv_cb_called = cl_recv_cb_called + 1;
        if (cl_recv_cb_called == 2) {
          uv_close((uv_handle_t *)&server,close_cb);
          return extraout_EAX_00;
        }
        goto LAB_00186af8;
      }
      goto LAB_00186b77;
    }
    if (req == (uv_udp_send_t *)0x0) {
      return (int)CONCAT71(0x5891,bVar8);
    }
    puStack_90 = (uv_loop_t *)0x186af8;
    cl_recv_cb_cold_10();
LAB_00186af8:
    puStack_90 = (uv_loop_t *)0x186b08;
    iVar1 = uv_ip6_name((sockaddr_in6 *)req,acStack_88,0x40);
    if (iVar1 != 0) goto LAB_00186b7c;
    puVar5 = &server;
    puStack_90 = (uv_loop_t *)0x186b23;
    iVar1 = uv_udp_set_membership(&server,"ff02::1",(char *)0x0,UV_LEAVE_GROUP);
    req = (uv_udp_send_t *)puVar5;
    if (iVar1 != 0) goto LAB_00186b81;
    puVar5 = &server;
    puStack_90 = (uv_loop_t *)0x186b45;
    iVar1 = uv_udp_set_source_membership(&server,"ff02::1",(char *)0x0,acStack_88,UV_JOIN_GROUP);
    req = (uv_udp_send_t *)puVar5;
    if (iVar1 == 0) {
      req = &req_ss;
      puStack_90 = (uv_loop_t *)0x186b55;
      iVar1 = do_send(&req_ss);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00186b8b;
    }
  }
  else {
    puStack_90 = (uv_loop_t *)0x186b63;
    cl_recv_cb_cold_1();
LAB_00186b63:
    puStack_90 = (uv_loop_t *)0x186b68;
    cl_recv_cb_cold_2();
LAB_00186b68:
    puStack_90 = (uv_loop_t *)0x186b6d;
    cl_recv_cb_cold_11();
LAB_00186b6d:
    puStack_90 = (uv_loop_t *)0x186b72;
    cl_recv_cb_cold_9();
LAB_00186b72:
    puStack_90 = (uv_loop_t *)0x186b77;
    cl_recv_cb_cold_3();
LAB_00186b77:
    req = puVar7;
    puStack_90 = (uv_loop_t *)0x186b7c;
    cl_recv_cb_cold_4();
LAB_00186b7c:
    puStack_90 = (uv_loop_t *)0x186b81;
    cl_recv_cb_cold_5();
LAB_00186b81:
    puStack_90 = (uv_loop_t *)0x186b86;
    cl_recv_cb_cold_6();
  }
  puStack_90 = (uv_loop_t *)0x186b8b;
  cl_recv_cb_cold_7();
LAB_00186b8b:
  puStack_90 = (uv_loop_t *)do_send;
  cl_recv_cb_cold_8();
  puStack_90 = unaff_RBX;
  uStack_c0 = uv_buf_init("PING",4);
  pcVar6 = "ff02::1";
  iVar1 = uv_ip6_addr("ff02::1",0x23a3,&sStack_ac);
  if (iVar1 == 0) {
    iVar1 = uv_udp_send(req,&client,&uStack_c0,1,(sockaddr *)&sStack_ac,sv_send_cb);
    return iVar1;
  }
  do_send_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)pcVar6);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)pcVar6,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(udp_multicast_join6) {
  int r;
  struct sockaddr_in6 addr;

  if (!can_ipv6_external())
    RETURN_SKIP("No external IPv6 interface available");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_JOIN_GROUP);
  if (r == UV_ENODEV) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("No ipv6 multicast route");
  }

  ASSERT(r == 0);

/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);
  
  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}